

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLeft3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *eps,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec,int *idx,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *rhs,int *ridx,int rn,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs2,int *ridx2,int rn2,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs3,int *ridx3,int rn3)

{
  int iVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if ((this->l).updateType == 0) {
    local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_68.m_backend.exp = (eps->m_backend).exp;
    local_68.m_backend.neg = (eps->m_backend).neg;
    local_68.m_backend.fpclass = (eps->m_backend).fpclass;
    local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar1 = solveUpdateLeft(this,&local_68,rhs,ridx,rn);
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_a8.m_backend.exp = (eps->m_backend).exp;
    local_a8.m_backend.neg = (eps->m_backend).neg;
    local_a8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar1 = solveUleft(this,&local_a8,vec,idx,rhs,ridx,iVar1);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_e8.m_backend.exp = (eps->m_backend).exp;
    local_e8.m_backend.neg = (eps->m_backend).neg;
    local_e8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar2 = solveUpdateLeft(this,&local_e8,rhs2,ridx2,rn2);
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_128.m_backend.exp = (eps->m_backend).exp;
    local_128.m_backend.neg = (eps->m_backend).neg;
    local_128.m_backend.fpclass = (eps->m_backend).fpclass;
    local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_128,vec2,rhs2,ridx2,iVar2);
    local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_168.m_backend.exp = (eps->m_backend).exp;
    local_168.m_backend.neg = (eps->m_backend).neg;
    local_168.m_backend.fpclass = (eps->m_backend).fpclass;
    local_168.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar2 = solveUpdateLeft(this,&local_168,rhs3,ridx3,rn3);
    local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_1a8.m_backend.exp = (eps->m_backend).exp;
    local_1a8.m_backend.neg = (eps->m_backend).neg;
    local_1a8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_1a8,vec3,rhs3,ridx3,iVar2);
  }
  else {
    local_1e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_1e8.m_backend.exp = (eps->m_backend).exp;
    local_1e8.m_backend.neg = (eps->m_backend).neg;
    local_1e8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar1 = solveUleft(this,&local_1e8,vec,idx,rhs,ridx,rn);
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_228.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_228.m_backend.exp = (eps->m_backend).exp;
    local_228.m_backend.neg = (eps->m_backend).neg;
    local_228.m_backend.fpclass = (eps->m_backend).fpclass;
    local_228.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar1 = solveLleftForest(this,&local_228,vec,idx,iVar1);
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_268.m_backend.exp = (eps->m_backend).exp;
    local_268.m_backend.neg = (eps->m_backend).neg;
    local_268.m_backend.fpclass = (eps->m_backend).fpclass;
    local_268.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_268,vec2,rhs2,ridx2,rn2);
    solveLleftForestNoNZ(this,vec2);
    local_2a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_2a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_2a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_2a8.m_backend.exp = (eps->m_backend).exp;
    local_2a8.m_backend.neg = (eps->m_backend).neg;
    local_2a8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_2a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_2a8,vec3,rhs3,ridx3,rn3);
    solveLleftForestNoNZ(this,vec3);
  }
  local_2e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_2e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_2e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_2e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_2e8.m_backend.exp = (eps->m_backend).exp;
  local_2e8.m_backend.neg = (eps->m_backend).neg;
  local_2e8.m_backend.fpclass = (eps->m_backend).fpclass;
  local_2e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar1 = solveLleft(this,&local_2e8,vec,idx,iVar1);
  solveLleftNoNZ(this,vec2);
  solveLleftNoNZ(this,vec3);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft3(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2,          /* rhs2    */
                              R* vec3,                               /* result3 */
                              R* rhs3, int* ridx3, int rn3)          /* rhs3    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      rn3 = solveUpdateLeft(eps, rhs3, ridx3, rn3);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
      solveLleftForestNoNZ(vec3);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);
   solveLleftNoNZ(vec3);

   return rn;
}